

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O0

GameResult * __thiscall Game::play(Game *this)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  int *piVar4;
  int extraout_var;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference piVar8;
  vector<Ghost_State,_std::allocator<Ghost_State>_> *this_00;
  reference pGVar9;
  reference ppAVar10;
  int extraout_var_00;
  vector<char,_std::allocator<char>_> *pvVar11;
  reference pvVar12;
  char *pcVar13;
  float fVar14;
  float fVar15;
  char local_5c8 [8];
  char str_5 [200];
  int iStack_4f0;
  int iStack_4ec;
  char cell_content_1;
  Position next_pos_1;
  Direction ghost_direction;
  Ghost_State *ghost_1;
  uint local_4d0;
  int local_4cc;
  int i_1;
  char str_4 [200];
  Ghost_State *ghost;
  iterator __end7;
  iterator __begin7;
  vector<Ghost_State,_std::allocator<Ghost_State>_> *__range7;
  int local_3d0;
  int local_3cc;
  iterator iStack_3c8;
  int ghost_id;
  iterator __end6;
  iterator __begin6;
  vector<int,_std::allocator<int>_> *__range6;
  vector<int,_std::allocator<int>_> ghosts_pos;
  char str_3 [200];
  char local_2c8 [8];
  char str_2 [200];
  int iStack_1f8;
  int iStack_1f4;
  char cell_content;
  Position next_pos;
  int i;
  allocator<Position> local_1d9;
  undefined1 local_1d8 [8];
  vector<Position,_std::allocator<Position>_> ghost_previous_pos;
  Position pacman_previous_pos;
  Direction pacman_direction;
  char local_1a8 [8];
  char str_1 [200];
  char local_d8 [8];
  char str [200];
  Game *this_local;
  
  str._192_8_ = this;
  if ((this->loaded_maze & 1U) == 0) {
    sprintf(local_d8,"Try to play without a loaded maze");
    poVar3 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                            );
    poVar3 = std::operator<<(poVar3,"][");
    poVar3 = std::operator<<(poVar3,"play");
    poVar3 = std::operator<<(poVar3,"][Line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xab);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,local_d8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if (this->pacman == (Agent *)0x0) {
    sprintf(local_1a8,"Try to play without an agent");
    poVar3 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                            );
    poVar3 = std::operator<<(poVar3,"][");
    poVar3 = std::operator<<(poVar3,"play");
    poVar3 = std::operator<<(poVar3,"][Line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xac);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,local_1a8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if (Arguments::plays == 1) {
    poVar3 = operator<<((ostream *)&std::cout,&this->state);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  do {
    if ((this->state).n_powerpills_left + (this->state).n_normal_pills_left < 1) break;
    if (Arguments::plays == 1) {
      std::ostream::flush();
      usleep((__useconds_t)(long)Arguments::visualization_speed);
    }
    update_ghost_states(this);
    (this->state).round = (this->state).round + 1;
    pacman_direction.j = 0;
    pacman_direction.i = (this->state).n_rounds_powerpill + -1;
    piVar4 = std::max<int>(&pacman_direction.j,&pacman_direction.i);
    (this->state).n_rounds_powerpill = *piVar4;
    pacman_previous_pos.i = (**this->pacman->_vptr_Agent)(this->pacman,&this->state,0);
    pacman_previous_pos.j = extraout_var;
    ghost_previous_pos.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)&(this->state).pacman.pos;
    sVar5 = (size_type)State::n_ghosts;
    std::allocator<Position>::allocator(&local_1d9);
    std::vector<Position,_std::allocator<Position>_>::vector
              ((vector<Position,_std::allocator<Position>_> *)local_1d8,sVar5,&local_1d9);
    std::allocator<Position>::~allocator(&local_1d9);
    for (next_pos.i = 0; next_pos.i < State::n_ghosts; next_pos.i = next_pos.i + 1) {
      pvVar6 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator[]
                         (&(this->state).ghosts,(long)next_pos.i);
      pvVar7 = std::vector<Position,_std::allocator<Position>_>::operator[]
                         ((vector<Position,_std::allocator<Position>_> *)local_1d8,(long)next_pos.i)
      ;
      Position::operator=(pvVar7,(Position *)pvVar6);
    }
    bVar2 = operator==(&(this->state).pacman.dir,(Direction *)&pacman_previous_pos);
    if (bVar2) {
      (this->state).pacman.step = Arguments::pacman_speed + (this->state).pacman.step;
      if ((this->state).pacman.step < 1.0) goto LAB_0010dcc0;
      (this->state).pacman.step = (this->state).pacman.step + -1.0;
      _iStack_1f8 = Position::move_destination
                              (&(this->state).pacman.pos,(Direction *)&pacman_previous_pos);
      pvVar11 = Matrix<char>::operator[](&(this->state).maze,iStack_1f8);
      pvVar12 = std::vector<char,_std::allocator<char>_>::operator[](pvVar11,(long)iStack_1f4);
      str_2[199] = *pvVar12;
      if (str_2[199] == '%') {
        sprintf(local_2c8,"Pacman crashes with wall");
        poVar3 = std::operator<<((ostream *)&std::cout,"Debug[");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                );
        poVar3 = std::operator<<(poVar3,"][");
        poVar3 = std::operator<<(poVar3,"play");
        poVar3 = std::operator<<(poVar3,"][Line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xcf);
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,local_2c8);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        goto LAB_0010dcc0;
      }
      if (str_2[199] == 'X') {
        sprintf((char *)&ghosts_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,"Pacman crashes with spawn area")
        ;
        poVar3 = std::operator<<((ostream *)&std::cout,"Debug[");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                );
        poVar3 = std::operator<<(poVar3,"][");
        poVar3 = std::operator<<(poVar3,"play");
        poVar3 = std::operator<<(poVar3,"][Line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd2);
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,(char *)&ghosts_pos.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                      ,0xd3,"GameResult &Game::play()");
      }
      Position::move(&(this->state).pacman.pos,(Direction *)&pacman_previous_pos);
      State::ghosts_in_position
                ((vector<int,_std::allocator<int>_> *)&__range6,&this->state,
                 (Position *)&stack0xfffffffffffffe08);
      __end6 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range6);
      iStack_3c8 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)&__range6);
      while (bVar2 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffc38), bVar2) {
        piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end6);
        local_3cc = *piVar8;
        pvVar6 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator[]
                           (&(this->state).ghosts,(long)local_3cc);
        bVar2 = game_over_on_collision(this,pvVar6);
        if (bVar2) {
          local_4cc = 9;
          goto LAB_0010dc41;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end6);
      }
      if (str_2[199] != ' ') {
        if (str_2[199] == '.') {
          pvVar11 = Matrix<char>::operator[](&(this->state).maze,iStack_1f8);
          pvVar12 = std::vector<char,_std::allocator<char>_>::operator[](pvVar11,(long)iStack_1f4);
          *pvVar12 = ' ';
          (this->state).n_normal_pills_left = (this->state).n_normal_pills_left + -1;
          local_3d0 = PathMagic::id((Position *)&stack0xfffffffffffffe08);
          std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::erase
                    (&(this->state).pills,&local_3d0);
          (*this->pacman->_vptr_Agent[2])();
        }
        else {
          if (str_2[199] != 'o') {
            sprintf((char *)&i_1,"Invalid cell_content character \'%c\'",
                    (ulong)(uint)(int)str_2[199]);
            poVar3 = std::operator<<((ostream *)&std::cout,"Error[");
            poVar3 = std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                    );
            poVar3 = std::operator<<(poVar3,"][");
            poVar3 = std::operator<<(poVar3,"play");
            poVar3 = std::operator<<(poVar3,"][Line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf1);
            poVar3 = std::operator<<(poVar3,"] ");
            poVar3 = std::operator<<(poVar3,(char *)&i_1);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            exit(1);
          }
          pvVar11 = Matrix<char>::operator[](&(this->state).maze,iStack_1f8);
          pvVar12 = std::vector<char,_std::allocator<char>_>::operator[](pvVar11,(long)iStack_1f4);
          *pvVar12 = ' ';
          (this->state).n_powerpills_left = (this->state).n_powerpills_left + -1;
          __range7._4_4_ = PathMagic::id((Position *)&stack0xfffffffffffffe08);
          std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::erase
                    (&(this->state).pills,(key_type *)((long)&__range7 + 4));
          __range7._0_4_ = PathMagic::id((Position *)&stack0xfffffffffffffe08);
          std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::erase
                    (&(this->state).powerpills,(key_type *)&__range7);
          (*this->pacman->_vptr_Agent[3])();
          this_00 = &(this->state).ghosts;
          __end7 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::begin(this_00);
          ghost = (Ghost_State *)
                  std::vector<Ghost_State,_std::allocator<Ghost_State>_>::end(this_00);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end7,(__normal_iterator<Ghost_State_*,_std::vector<Ghost_State,_std::allocator<Ghost_State>_>_>
                                             *)&ghost), bVar2) {
            pGVar9 = __gnu_cxx::
                     __normal_iterator<Ghost_State_*,_std::vector<Ghost_State,_std::allocator<Ghost_State>_>_>
                     ::operator*(&__end7);
            pGVar9->maybe_scared = true;
            __gnu_cxx::
            __normal_iterator<Ghost_State_*,_std::vector<Ghost_State,_std::allocator<Ghost_State>_>_>
            ::operator++(&__end7);
          }
          (this->state).n_rounds_powerpill = Arguments::n_rounds_powerpill;
        }
      }
      local_4cc = 0;
LAB_0010dc41:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range6);
      if (local_4cc == 0) goto LAB_0010dcc0;
    }
    else {
      (*this->pacman->_vptr_Agent[5])();
      (this->state).pacman.step = (1.0 - (this->state).pacman.step) * Arguments::pacman_speed;
      Direction::operator=(&(this->state).pacman.dir,(Direction *)&pacman_previous_pos);
LAB_0010dcc0:
      local_4d0 = 0;
      while( true ) {
        uVar1 = local_4d0;
        ghost_1._4_4_ = (this->state).round / Arguments::n_rounds_between_ghosts_start + 1;
        sVar5 = std::vector<Agent_*,_std::allocator<Agent_*>_>::size(&this->ghosts);
        ghost_1._0_4_ = (undefined4)sVar5;
        piVar4 = std::min<int>((int *)((long)&ghost_1 + 4),(int *)&ghost_1);
        if (*piVar4 <= (int)uVar1) break;
        pvVar6 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator[]
                           (&(this->state).ghosts,(long)(int)local_4d0);
        bVar2 = Ghost_State::is_alive(pvVar6);
        if (bVar2) {
          ppAVar10 = std::vector<Agent_*,_std::allocator<Agent_*>_>::operator[]
                               (&this->ghosts,(long)(int)local_4d0);
          next_pos_1.i = (**(*ppAVar10)->_vptr_Agent)(*ppAVar10,&this->state,(ulong)local_4d0);
          next_pos_1.j = extraout_var_00;
          bVar2 = operator==((Direction *)&next_pos_1,&(pvVar6->super_Agent_State).dir);
          if (bVar2) {
            fVar14 = ghost_speed(this,local_4d0);
            (pvVar6->super_Agent_State).step = fVar14 + (pvVar6->super_Agent_State).step;
            if (1.0 <= (pvVar6->super_Agent_State).step) {
              (pvVar6->super_Agent_State).step = (pvVar6->super_Agent_State).step + -1.0;
              _iStack_4f0 = Position::move_destination((Position *)pvVar6,(Direction *)&next_pos_1);
              pvVar11 = Matrix<char>::operator[](&(this->state).maze,iStack_4f0);
              pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                                  (pvVar11,(long)iStack_4ec);
              if (*pvVar12 == '%') {
                sprintf(local_5c8,"Ghost #%d at [%d,%d] crashes with wall",(ulong)local_4d0,
                        (ulong)(uint)(pvVar6->super_Agent_State).pos.i,
                        (ulong)(uint)(pvVar6->super_Agent_State).pos.j);
                poVar3 = std::operator<<((ostream *)&std::cout,"Debug[");
                poVar3 = std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                        );
                poVar3 = std::operator<<(poVar3,"][");
                poVar3 = std::operator<<(poVar3,"play");
                poVar3 = std::operator<<(poVar3,"][Line ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10c);
                poVar3 = std::operator<<(poVar3,"] ");
                poVar3 = std::operator<<(poVar3,local_5c8);
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              }
              else {
                Position::move((Position *)pvVar6,(Direction *)&next_pos_1);
                bVar2 = operator==(&(this->state).pacman.pos,(Position *)&stack0xfffffffffffffb10);
                if ((bVar2) && (bVar2 = game_over_on_collision(this,pvVar6), bVar2)) {
                  local_4cc = 9;
                  goto LAB_0010e1da;
                }
              }
            }
          }
          else {
            fVar14 = (pvVar6->super_Agent_State).step;
            fVar15 = ghost_speed(this,local_4d0);
            (pvVar6->super_Agent_State).step = (1.0 - fVar14) * fVar15;
            Direction::operator=(&(pvVar6->super_Agent_State).dir,(Direction *)&next_pos_1);
          }
        }
        else if (pvVar6->n_rounds_revive == 1) {
          Position::operator=((Position *)pvVar6,&pvVar6->initial_pos);
          pvVar6->n_rounds_revive = 0;
        }
        else {
          pvVar6->n_rounds_revive = pvVar6->n_rounds_revive + -1;
        }
        pvVar7 = std::vector<Position,_std::allocator<Position>_>::operator[]
                           ((vector<Position,_std::allocator<Position>_> *)local_1d8,
                            (long)(int)local_4d0);
        pvVar6 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator[]
                           (&(this->state).ghosts,(long)(int)local_4d0);
        Position::operator=(&(pvVar6->super_Agent_State).prev,pvVar7);
        local_4d0 = local_4d0 + 1;
      }
      Position::operator=(&(this->state).pacman.prev,
                          (Position *)
                          &ghost_previous_pos.
                           super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      if (Arguments::plays == 1) {
        poVar3 = operator<<((ostream *)&std::cout,&this->state);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      local_4cc = 0;
    }
LAB_0010e1da:
    std::vector<Position,_std::allocator<Position>_>::~vector
              ((vector<Position,_std::allocator<Position>_> *)local_1d8);
  } while (local_4cc == 0);
  if (Arguments::plays == 1) {
    poVar3 = operator<<((ostream *)&std::cout,&this->state);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar13 = "WON";
    if ((this->game_over & 1U) != 0) {
      pcVar13 = "LOST";
    }
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar13);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  (this->result).won = (bool)((this->game_over ^ 0xffU) & 1);
  (this->result).completion =
       1.0 - (double)((this->state).n_normal_pills_left + (this->state).n_powerpills_left) /
             (double)State::total_pills;
  (*this->pacman->_vptr_Agent[1])(this->pacman,(ulong)(this->result).won & 1);
  return &this->result;
}

Assistant:

GameResult& play() {
        ensure(loaded_maze, "Try to play without a loaded maze");
        ensure(pacman != NULL, "Try to play without an agent");

        if (Arguments::plays == 1) cout << state << endl;

        while (state.n_powerpills_left + state.n_normal_pills_left > 0) { // break if game_over
            if (Arguments::plays == 1) {
                cout.flush();
                usleep(Arguments::visualization_speed);
            }

            update_ghost_states();

            ++state.round;

            state.n_rounds_powerpill = max(0, state.n_rounds_powerpill - 1);

            Direction pacman_direction = pacman->take_action(state, 0);

            Position pacman_previous_pos = state.pacman.pos;
            vector<Position> ghost_previous_pos(state.n_ghosts);
            for (int i = 0; i < state.n_ghosts; ++i) ghost_previous_pos[i] = state.ghosts[i].pos;

            // TODO: Maybe process movements stochastically to guarantee equality?

            if (state.pacman.dir == pacman_direction) {
                state.pacman.step += Arguments::pacman_speed;

                if (state.pacman.step >= 1) {
                    --state.pacman.step;

                    Position next_pos = state.pacman.pos.move_destination(pacman_direction);
                    char cell_content = state.maze[next_pos.i][next_pos.j];


                    if (cell_content == State::WALL) {
                        _debug("Pacman crashes with wall");
                    }
                    else if (cell_content == State::SPAWN_AREA) {
                        _debug("Pacman crashes with spawn area");
                        assert(false);
                    }
                    else {
                        state.pacman.pos.move(pacman_direction);

                        vector<int> ghosts_pos = state.ghosts_in_position(next_pos);

                        for (int ghost_id : ghosts_pos)
                            if (game_over_on_collision(state.ghosts[ghost_id]))
                                goto end;

                        switch(cell_content) {
                            case State::PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_normal_pills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_pill();
                                break;
                            case State::POWER_PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_powerpills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                state.powerpills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_powerpill();

                                for (Ghost_State& ghost : state.ghosts) ghost.maybe_scared = true;

                                state.n_rounds_powerpill = Arguments::n_rounds_powerpill;
                                break;
                            case State::FREE: break;
                            default: ensure(false, "Invalid cell_content character '%c'", cell_content);
                        }
                    }
                }
            }
            else {
                pacman->notify_reverse_direction();
                state.pacman.step = (1 - state.pacman.step)*Arguments::pacman_speed;
                state.pacman.dir = pacman_direction;
            }

            for (int i = 0; i < min(1 + state.round/Arguments::n_rounds_between_ghosts_start, (int) ghosts.size()); ++i) {
                Ghost_State& ghost = state.ghosts[i];

                if (ghost.is_alive()) {
                    Direction ghost_direction = ghosts[i]->take_action(state, i);

                    if (ghost_direction == ghost.dir) {
                        ghost.step += ghost_speed(i);

                        if (ghost.step >= 1) {
                            --ghost.step;

                            Position next_pos = ghost.pos.move_destination(ghost_direction);
                            char cell_content = state.maze[next_pos.i][next_pos.j];

                            if (cell_content == State::WALL) {
                                _debug("Ghost #%d at [%d,%d] crashes with wall", i, ghost.pos.i, ghost.pos.j);
                            }
                            else {
                                ghost.pos.move(ghost_direction);

                                if (state.pacman.pos == next_pos and game_over_on_collision(ghost))
                                    goto end;
                            }
                        }
                    }
                    else {
                        ghost.step = (1 - ghost.step)*ghost_speed(i);
                        ghost.dir = ghost_direction;
                    }
                }
                else if (ghost.n_rounds_revive == 1) {
                    ghost.pos = ghost.initial_pos;
                    ghost.n_rounds_revive = 0;
                }
                else {
                    --ghost.n_rounds_revive;
                }

                state.ghosts[i].prev = ghost_previous_pos[i];
            }

            state.pacman.prev = pacman_previous_pos;

            if (Arguments::plays == 1) cout << state << endl;
        }

        end:

        if (Arguments::plays == 1) {
            cout << state << endl;
            cout << (game_over ? "LOST" : "WON") << endl;
        }

        this->result.won = not game_over;
        this->result.completion = 1 - (state.n_normal_pills_left + state.n_powerpills_left)/double(state.total_pills);
        pacman->notify_game_result(this->result.won);
        return this->result;
    }